

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O1

void __thiscall
pbrt::ImageAndMetadata::ImageAndMetadata(ImageAndMetadata *this,ImageAndMetadata *param_1)

{
  size_t sVar1;
  memory_resource *pmVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y =
       (param_1->image).resolution.super_Tuple2<pbrt::Point2,_int>.y;
  iVar10 = (param_1->image).resolution.super_Tuple2<pbrt::Point2,_int>.x;
  (this->image).format = (param_1->image).format;
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x = iVar10;
  (this->image).channelNames.alloc.memoryResource =
       (param_1->image).channelNames.alloc.memoryResource;
  (this->image).channelNames.nStored = 0;
  (this->image).channelNames.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->image).channelNames.nAlloc = 0;
  sVar1 = (param_1->image).channelNames.nStored;
  (this->image).channelNames.nAlloc = (param_1->image).channelNames.nAlloc;
  (this->image).channelNames.nStored = sVar1;
  (this->image).channelNames.ptr = (param_1->image).channelNames.ptr;
  (param_1->image).channelNames.nStored = 0;
  (param_1->image).channelNames.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (param_1->image).channelNames.nAlloc = 0;
  (this->image).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  pmVar2 = (param_1->image).p8.alloc.memoryResource;
  (this->image).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (param_1->image).encoding.
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         .bits;
  (this->image).p8.alloc.memoryResource = pmVar2;
  (this->image).p8.ptr = (uchar *)0x0;
  (this->image).p8.nAlloc = 0;
  (this->image).p8.nStored = 0;
  sVar1 = (param_1->image).p8.nStored;
  (this->image).p8.nAlloc = (param_1->image).p8.nAlloc;
  (this->image).p8.nStored = sVar1;
  (this->image).p8.ptr = (param_1->image).p8.ptr;
  (param_1->image).p8.nStored = 0;
  (param_1->image).p8.ptr = (uchar *)0x0;
  (param_1->image).p8.nAlloc = 0;
  (this->image).p16.alloc.memoryResource = (param_1->image).p16.alloc.memoryResource;
  (this->image).p16.nStored = 0;
  (this->image).p16.ptr = (Half *)0x0;
  (this->image).p16.nAlloc = 0;
  sVar1 = (param_1->image).p16.nStored;
  (this->image).p16.nAlloc = (param_1->image).p16.nAlloc;
  (this->image).p16.nStored = sVar1;
  (this->image).p16.ptr = (param_1->image).p16.ptr;
  (param_1->image).p16.nStored = 0;
  (param_1->image).p16.ptr = (Half *)0x0;
  (param_1->image).p16.nAlloc = 0;
  (this->image).p32.alloc.memoryResource = (param_1->image).p32.alloc.memoryResource;
  (this->image).p32.nStored = 0;
  (this->image).p32.ptr = (float *)0x0;
  (this->image).p32.nAlloc = 0;
  sVar1 = (param_1->image).p32.nStored;
  (this->image).p32.nAlloc = (param_1->image).p32.nAlloc;
  (this->image).p32.nStored = sVar1;
  (this->image).p32.ptr = (param_1->image).p32.ptr;
  (param_1->image).p32.nStored = 0;
  (param_1->image).p32.ptr = (float *)0x0;
  (param_1->image).p32.nAlloc = 0;
  (this->metadata).renderTimeSeconds.set = (param_1->metadata).renderTimeSeconds.set;
  if ((param_1->metadata).renderTimeSeconds.set == true) {
    (this->metadata).renderTimeSeconds.optionalValue =
         (param_1->metadata).renderTimeSeconds.optionalValue;
    (param_1->metadata).renderTimeSeconds.set = false;
  }
  (this->metadata).cameraFromWorld.set = (param_1->metadata).cameraFromWorld.set;
  if ((param_1->metadata).cameraFromWorld.set == true) {
    uVar3 = *(undefined8 *)((long)&(param_1->metadata).cameraFromWorld.optionalValue + 8);
    uVar4 = *(undefined8 *)((long)&(param_1->metadata).cameraFromWorld.optionalValue + 0x10);
    uVar5 = *(undefined8 *)((long)&(param_1->metadata).cameraFromWorld.optionalValue + 0x18);
    uVar6 = *(undefined8 *)((long)&(param_1->metadata).cameraFromWorld.optionalValue + 0x20);
    uVar7 = *(undefined8 *)((long)&(param_1->metadata).cameraFromWorld.optionalValue + 0x28);
    uVar8 = *(undefined8 *)((long)&(param_1->metadata).cameraFromWorld.optionalValue + 0x30);
    uVar9 = *(undefined8 *)((long)&(param_1->metadata).cameraFromWorld.optionalValue + 0x38);
    *(undefined8 *)&(this->metadata).cameraFromWorld.optionalValue =
         *(undefined8 *)&(param_1->metadata).cameraFromWorld.optionalValue;
    *(undefined8 *)((long)&(this->metadata).cameraFromWorld.optionalValue + 8) = uVar3;
    *(undefined8 *)((long)&(this->metadata).cameraFromWorld.optionalValue + 0x10) = uVar4;
    *(undefined8 *)((long)&(this->metadata).cameraFromWorld.optionalValue + 0x18) = uVar5;
    *(undefined8 *)((long)&(this->metadata).cameraFromWorld.optionalValue + 0x20) = uVar6;
    *(undefined8 *)((long)&(this->metadata).cameraFromWorld.optionalValue + 0x28) = uVar7;
    *(undefined8 *)((long)&(this->metadata).cameraFromWorld.optionalValue + 0x30) = uVar8;
    *(undefined8 *)((long)&(this->metadata).cameraFromWorld.optionalValue + 0x38) = uVar9;
    if ((param_1->metadata).cameraFromWorld.set == true) {
      (param_1->metadata).cameraFromWorld.set = false;
    }
  }
  (this->metadata).NDCFromWorld.set = (param_1->metadata).NDCFromWorld.set;
  if ((param_1->metadata).NDCFromWorld.set == true) {
    uVar3 = *(undefined8 *)((long)&(param_1->metadata).NDCFromWorld.optionalValue + 8);
    uVar4 = *(undefined8 *)((long)&(param_1->metadata).NDCFromWorld.optionalValue + 0x10);
    uVar5 = *(undefined8 *)((long)&(param_1->metadata).NDCFromWorld.optionalValue + 0x18);
    uVar6 = *(undefined8 *)((long)&(param_1->metadata).NDCFromWorld.optionalValue + 0x20);
    uVar7 = *(undefined8 *)((long)&(param_1->metadata).NDCFromWorld.optionalValue + 0x28);
    uVar8 = *(undefined8 *)((long)&(param_1->metadata).NDCFromWorld.optionalValue + 0x30);
    uVar9 = *(undefined8 *)((long)&(param_1->metadata).NDCFromWorld.optionalValue + 0x38);
    *(undefined8 *)&(this->metadata).NDCFromWorld.optionalValue =
         *(undefined8 *)&(param_1->metadata).NDCFromWorld.optionalValue;
    *(undefined8 *)((long)&(this->metadata).NDCFromWorld.optionalValue + 8) = uVar3;
    *(undefined8 *)((long)&(this->metadata).NDCFromWorld.optionalValue + 0x10) = uVar4;
    *(undefined8 *)((long)&(this->metadata).NDCFromWorld.optionalValue + 0x18) = uVar5;
    *(undefined8 *)((long)&(this->metadata).NDCFromWorld.optionalValue + 0x20) = uVar6;
    *(undefined8 *)((long)&(this->metadata).NDCFromWorld.optionalValue + 0x28) = uVar7;
    *(undefined8 *)((long)&(this->metadata).NDCFromWorld.optionalValue + 0x30) = uVar8;
    *(undefined8 *)((long)&(this->metadata).NDCFromWorld.optionalValue + 0x38) = uVar9;
    if ((param_1->metadata).NDCFromWorld.set == true) {
      (param_1->metadata).NDCFromWorld.set = false;
    }
  }
  (this->metadata).pixelBounds.set = (param_1->metadata).pixelBounds.set;
  if ((param_1->metadata).pixelBounds.set == true) {
    uVar3 = *(undefined8 *)((long)&(param_1->metadata).pixelBounds.optionalValue + 8);
    *(undefined8 *)&(this->metadata).pixelBounds.optionalValue =
         *(undefined8 *)&(param_1->metadata).pixelBounds.optionalValue;
    *(undefined8 *)((long)&(this->metadata).pixelBounds.optionalValue + 8) = uVar3;
    if ((param_1->metadata).pixelBounds.set == true) {
      (param_1->metadata).pixelBounds.set = false;
    }
  }
  (this->metadata).fullResolution.set = (param_1->metadata).fullResolution.set;
  if (((param_1->metadata).fullResolution.set == true) &&
     ((this->metadata).fullResolution.optionalValue =
           (param_1->metadata).fullResolution.optionalValue,
     (param_1->metadata).fullResolution.set == true)) {
    (param_1->metadata).fullResolution.set = false;
  }
  (this->metadata).samplesPerPixel.set = (param_1->metadata).samplesPerPixel.set;
  if ((param_1->metadata).samplesPerPixel.set == true) {
    (this->metadata).samplesPerPixel.optionalValue =
         (param_1->metadata).samplesPerPixel.optionalValue;
    (param_1->metadata).samplesPerPixel.set = false;
  }
  (this->metadata).MSE.set = (param_1->metadata).MSE.set;
  if ((param_1->metadata).MSE.set == true) {
    (this->metadata).MSE.optionalValue = (param_1->metadata).MSE.optionalValue;
    (param_1->metadata).MSE.set = false;
  }
  (this->metadata).colorSpace.set = (param_1->metadata).colorSpace.set;
  if ((param_1->metadata).colorSpace.set == true) {
    (this->metadata).colorSpace.optionalValue = (param_1->metadata).colorSpace.optionalValue;
    (param_1->metadata).colorSpace.set = false;
  }
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header,
             &(param_1->metadata).stringVectors._M_t._M_impl.super__Rb_tree_header);
  return;
}

Assistant:

Image(Allocator alloc = {})
        : p8(alloc),
          p16(alloc),
          p32(alloc),
          format(PixelFormat::U256),
          resolution(0, 0) {}